

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_rumors(char *in_tru,char *in_false,char *outfile)

{
  long lVar1;
  char *pcVar2;
  long true_rumor_size;
  char *outfile_local;
  char *in_false_local;
  char *in_tru_local;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror(outfile);
    exit(1);
  }
  fprintf((FILE *)ofp,"%s",Dont_Edit_Data);
  ifp = (FILE *)fopen(in_tru,"r");
  if ((FILE *)ifp != (FILE *)0x0) {
    fseek((FILE *)ifp,0,2);
    lVar1 = ftell((FILE *)ifp);
    fprintf((FILE *)ofp,"%06lx\n",lVar1);
    fseek((FILE *)ifp,0,0);
    while (pcVar2 = fgets(in_line,0x100,(FILE *)ifp), pcVar2 != (char *)0x0) {
      pcVar2 = xcrypt(in_line);
      fputs(pcVar2,(FILE *)ofp);
    }
    fclose((FILE *)ifp);
    ifp = (FILE *)fopen(in_false,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      while (pcVar2 = fgets(in_line,0x100,(FILE *)ifp), pcVar2 != (char *)0x0) {
        pcVar2 = xcrypt(in_line);
        fputs(pcVar2,(FILE *)ofp);
      }
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
    perror(in_false);
    fclose((FILE *)ofp);
    unlink(outfile);
    exit(1);
  }
  perror(in_tru);
  fclose((FILE *)ofp);
  unlink(outfile);
  exit(1);
}

Assistant:

void do_rumors(const char *in_tru, const char *in_false, const char *outfile)
{
	long	true_rumor_size;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	fprintf(ofp, "%s", Dont_Edit_Data);

	if (!(ifp = fopen(in_tru, RDTMODE))) {
		perror(in_tru);
		fclose(ofp);
		unlink(outfile);	/* kill empty output file */
		exit(EXIT_FAILURE);
	}

	/* get size of true rumors file */
	fseek(ifp, 0L, SEEK_END);
	true_rumor_size = ftell(ifp);
	fprintf(ofp,"%06lx\n", true_rumor_size);
	fseek(ifp, 0L, SEEK_SET);

	/* copy true rumors */
	while (fgets(in_line, sizeof in_line, ifp) != 0)
		fputs(xcrypt(in_line), ofp);

	fclose(ifp);

	if (!(ifp = fopen(in_false, RDTMODE))) {
		perror(in_false);
		fclose(ofp);
		unlink(outfile);	/* kill incomplete output file */
		exit(EXIT_FAILURE);
	}

	/* copy false rumors */
	while (fgets(in_line, sizeof in_line, ifp) != 0)
		fputs(xcrypt(in_line), ofp);

	fclose(ifp);
	fclose(ofp);
	return;
}